

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 floatx80_to_float128_s390x(floatx80 a,float_status *status)

{
  ulong uVar1;
  ushort uVar2;
  ulong uVar3;
  float128 fVar4;
  floatx80 a_00;
  commonNaNT local_20;
  
  uVar3 = a.low;
  uVar2 = a.high & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)uVar3 < 0)
  {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
        uVar2 != 0x7fff) {
      uVar1 = uVar3 << 0x31;
      uVar3 = (ulong)uVar2 << 0x30 | (a._8_8_ >> 0xf) << 0x3f | uVar3 >> 0xf & 0xffffffffffff;
      goto LAB_00ac12ab;
    }
    a_00._8_8_ = a._8_8_ & 0xffffffff;
    a_00.low = uVar3;
    floatx80ToCommonNaN(&local_20,a_00,status);
    if (status->default_nan_mode == '\0') {
      uVar1 = local_20.low >> 0x10 | local_20.high << 0x30;
      uVar3 = (ulong)(uint)local_20._0_4_ << 0x3f | local_20.high >> 0x10 | 0x7fff000000000000;
      goto LAB_00ac12ab;
    }
  }
  else {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  uVar3 = 0x7fff800000000000;
  uVar1 = 0;
LAB_00ac12ab:
  fVar4.high = uVar3;
  fVar4.low = uVar1;
  return fVar4;
}

Assistant:

float128 floatx80_to_float128(floatx80 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig, zSig0, zSig1;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return float128_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( ( aExp == 0x7FFF ) && (uint64_t) ( aSig<<1 ) ) {
        return commonNaNToFloat128(floatx80ToCommonNaN(a, status), status);
    }
    shift128Right( aSig<<1, 0, 16, &zSig0, &zSig1 );
    return packFloat128( aSign, aExp, zSig0, zSig1 );

}